

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

int UnicodeDataComp(void *pnKey,void *elem)

{
  WORD rangeValue;
  WCHAR uValue;
  void *elem_local;
  void *pnKey_local;
  
  if (*pnKey < (int)(uint)*elem) {
    pnKey_local._4_4_ = -1;
  }
  else if ((int)((uint)*elem + (uint)*(ushort *)((long)elem + 6)) < *pnKey) {
    pnKey_local._4_4_ = 1;
  }
  else {
    pnKey_local._4_4_ = 0;
  }
  return pnKey_local._4_4_;
}

Assistant:

static int UnicodeDataComp(const void *pnKey, const void *elem)
{
    WCHAR uValue = ((UnicodeDataRec*)elem)->nUnicodeValue;
    WORD  rangeValue = ((UnicodeDataRec*)elem)->rangeValue;

    if (*((INT*)pnKey) < uValue)
    {
        return -1;
    }
    else
    {
        if (*((INT*)pnKey) > (uValue + rangeValue))
        {
            return 1;
        }
        else
        {
            return 0;
        }
    }
}